

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O3

bool __thiscall helics::TimeCoordinator::getOptionFlag(TimeCoordinator *this,int optionFlag)

{
  byte bVar1;
  invalid_argument *this_00;
  
  if (optionFlag < 10) {
    if (optionFlag == 1) {
      bVar1 = (this->info).uninterruptible;
    }
    else {
      if (optionFlag != 2) {
LAB_002fe264:
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"flag not recognized");
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      bVar1 = (this->info).uninterruptible ^ 1;
    }
  }
  else if (optionFlag == 10) {
    bVar1 = (this->info).wait_for_current_time_updates;
  }
  else if (optionFlag == 0xb) {
    bVar1 = (this->info).restrictive_time_policy;
  }
  else {
    if (optionFlag != 0x51) goto LAB_002fe264;
    bVar1 = (this->info).event_triggered;
  }
  return (bool)bVar1;
}

Assistant:

bool TimeCoordinator::getOptionFlag(int optionFlag) const
{
    switch (optionFlag) {
        case defs::Flags::UNINTERRUPTIBLE:
            return info.uninterruptible;
        case defs::Flags::INTERRUPTIBLE:
            return !info.uninterruptible;
        case defs::Flags::WAIT_FOR_CURRENT_TIME_UPDATE:
            return info.wait_for_current_time_updates;
        case defs::Flags::RESTRICTIVE_TIME_POLICY:
            return info.restrictive_time_policy;
        case defs::Flags::EVENT_TRIGGERED:
            return info.event_triggered;
        default:
            throw(std::invalid_argument("flag not recognized"));
    }
}